

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_multi_var
              (secp256k1_ecmult_context *ctx,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  secp256k1_fe *psVar8;
  uint uVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  bool bVar13;
  secp256k1_ge point;
  secp256k1_scalar scalar;
  secp256k1_gej pointj;
  secp256k1_gej tmpj;
  secp256k1_fe zr [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  code *local_e28;
  secp256k1_strauss_state local_e00;
  secp256k1_ge local_de0;
  secp256k1_scalar local_d88;
  secp256k1_gej local_d68;
  secp256k1_scalar local_ce8;
  secp256k1_gej local_cc8;
  secp256k1_fe local_c48 [8];
  secp256k1_strauss_point_state local_b08;
  secp256k1_ge local_6f8 [8];
  secp256k1_gej local_438 [8];
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (inp_g_sc == (secp256k1_scalar *)0x0 && n == 0) {
    return 1;
  }
  if (n == 0) {
    local_d68.x.n[2] = 0;
    local_d68.x.n[3] = 0;
    local_d68.x.n[0] = 0;
    local_d68.x.n[1] = 0;
    local_cc8.x.n[0] = (uint64_t)local_438;
    local_cc8.x.n[1] = (uint64_t)local_c48;
    local_cc8.x.n[2] = (uint64_t)local_6f8;
    local_cc8.x.n[3] = (uint64_t)&local_b08;
    secp256k1_ecmult_strauss_wnaf
              (ctx,(secp256k1_strauss_state *)&local_cc8,r,1,r,(secp256k1_scalar *)&local_d68,
               inp_g_sc);
    return 1;
  }
  if (scratch == (secp256k1_scratch *)0x0) {
    local_ce8.d[0] = 0;
    local_ce8.d[1] = 0;
    local_ce8.d[2] = 0;
    local_ce8.d[3] = 0;
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    (r->x).n[4] = 0;
    (r->y).n[0] = 0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
    (r->z).n[0] = 0;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    local_d68.x.n[0] = (uint64_t)local_438;
    local_d68.x.n[1] = (uint64_t)local_c48;
    local_d68.x.n[2] = (uint64_t)local_6f8;
    local_d68.x.n[3] = (uint64_t)&local_b08;
    secp256k1_ecmult_strauss_wnaf
              (ctx,(secp256k1_strauss_state *)&local_d68,r,1,&local_cc8,&local_ce8,inp_g_sc);
    sVar11 = 0;
    while (iVar2 = (*cb)(&local_d88,&local_de0,sVar11,cbdata), iVar2 != 0) {
      local_d68.infinity = local_de0.infinity;
      local_d68.x.n[4] = local_de0.x.n[4];
      local_d68.x.n[2] = local_de0.x.n[2];
      local_d68.x.n[3] = local_de0.x.n[3];
      local_d68.x.n[0] = local_de0.x.n[0];
      local_d68.x.n[1] = local_de0.x.n[1];
      local_d68.y.n[4] = local_de0.y.n[4];
      local_d68.y.n[2] = local_de0.y.n[2];
      local_d68.y.n[3] = local_de0.y.n[3];
      local_d68.y.n[0] = local_de0.y.n[0];
      local_d68.y.n[1] = local_de0.y.n[1];
      local_d68.z.n[0] = 1;
      local_d68.z.n[3] = 0;
      local_d68.z.n[4] = 0;
      local_d68.z.n[1] = 0;
      local_d68.z.n[2] = 0;
      local_e00.prej = local_438;
      local_e00.zr = local_c48;
      local_e00.pre_a = local_6f8;
      local_e00.ps = &local_b08;
      psVar8 = (secp256k1_fe *)0x1;
      secp256k1_ecmult_strauss_wnaf
                (ctx,&local_e00,&local_cc8,1,&local_d68,&local_d88,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r,r,&local_cc8,psVar8);
      sVar11 = sVar11 + 1;
      if (n == sVar11) {
        return 1;
      }
    }
  }
  else {
    sVar11 = scratch->frame;
    lVar3 = 0;
    if (sVar11 != 0) {
      sVar7 = 0;
      do {
        lVar3 = lVar3 + scratch->frame_size[sVar7];
        sVar7 = sVar7 + 1;
      } while (sVar11 != sVar7);
    }
    uVar10 = scratch->max_size - lVar3;
    uVar6 = 0;
    uVar5 = uVar10 - 0x60;
    if (uVar10 < 0x60) {
      uVar5 = uVar6;
    }
    uVar9 = 0x101;
    do {
      uVar10 = (ulong)(uVar9 - 0x100);
      switch(uVar9) {
      case 0x101:
        break;
      case 0x102:
        uVar10 = 0xb;
        break;
      case 0x103:
        uVar10 = 0x2d;
        break;
      case 0x104:
        uVar10 = 100;
        break;
      case 0x105:
        uVar10 = 0x113;
        break;
      case 0x106:
        uVar10 = 0x271;
        break;
      case 0x107:
        uVar10 = 0x73a;
        break;
      case 0x108:
        uVar10 = 0xd48;
        break;
      case 0x109:
        uVar10 = 0x259e;
        break;
      case 0x10a:
        uVar10 = 0x45ec;
        break;
      case 0x10b:
        uVar10 = 0x8020;
        break;
      case 0x10c:
        uVar10 = 0xffffffffffffffff;
        break;
      case 0x10d:
        goto switchD_001149b2_caseD_10d;
      default:
        uVar10 = 0;
      }
      bVar13 = false;
      uVar1 = uVar9 / (uVar9 - 0xff);
      uVar4 = (ulong)((0x80 << ((byte)(uVar9 - 0x100) & 0x1f)) + uVar1 * 4 + 0x9c);
      if (uVar4 <= uVar5) {
        uVar4 = (uVar5 - uVar4) / (ulong)(uVar1 * 4 + 0x8c);
        bVar13 = uVar10 <= uVar4;
        if (!bVar13) {
          uVar10 = uVar4;
        }
        if (uVar6 < uVar10) {
          uVar6 = uVar10;
        }
      }
      uVar9 = uVar9 + 1;
    } while (bVar13);
switchD_001149b2_caseD_10d:
    if (uVar6 != 0) {
      uVar5 = 10000000;
      if (uVar6 < 10000000) {
        uVar5 = uVar6;
      }
      uVar5 = ((n + uVar5) - 1) / uVar5;
      uVar6 = ((uVar5 + n) - 1) / uVar5;
      if (uVar6 < 0xa0) {
        if (sVar11 == 0) {
          lVar3 = 0;
        }
        else {
          lVar3 = 0;
          sVar7 = 0;
          do {
            lVar3 = lVar3 + scratch->frame_size[sVar7];
            sVar7 = sVar7 + 1;
          } while (sVar11 != sVar7);
        }
        uVar5 = scratch->max_size - lVar3;
        uVar6 = 0;
        if (0x5f < uVar5) {
          uVar6 = uVar5 - 0x60;
        }
        if (uVar6 < 0xcb0) {
          return 0;
        }
        uVar5 = ((n + uVar6 / 0xcb0) - 1) / (uVar6 / 0xcb0);
        uVar6 = ((uVar5 + n) - 1) / uVar5;
        local_e28 = secp256k1_ecmult_strauss_batch;
      }
      else {
        local_e28 = secp256k1_ecmult_pippenger_batch;
      }
      lVar12 = 0;
      lVar3 = 0;
      while( true ) {
        uVar10 = uVar6;
        if (n < uVar6) {
          uVar10 = n;
        }
        psVar8 = (secp256k1_fe *)0x0;
        if (lVar3 == 0) {
          psVar8 = (secp256k1_fe *)inp_g_sc;
        }
        iVar2 = (*local_e28)(ctx,scratch,&local_b08,psVar8,cb,cbdata,uVar10,lVar12);
        if (iVar2 == 0) break;
        secp256k1_gej_add_var(r,r,(secp256k1_gej *)&local_b08,psVar8);
        n = n - uVar10;
        lVar3 = lVar3 + 1;
        lVar12 = lVar12 + uVar6;
        if (uVar5 + (uVar5 == 0) == lVar3) {
          return 1;
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_ecmult_context *ctx, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_ecmult_context*, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t max_points;
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_scalar szero;
        secp256k1_scalar_set_int(&szero, 0);
        secp256k1_ecmult(ctx, r, r, &szero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_var_simple(ctx, r, inp_g_sc, cb, cbdata, n);
    }

    max_points = secp256k1_pippenger_max_points(scratch);
    if (max_points == 0) {
        return 0;
    } else if (max_points > ECMULT_MAX_POINTS_PER_BATCH) {
        max_points = ECMULT_MAX_POINTS_PER_BATCH;
    }
    n_batches = (n+max_points-1)/max_points;
    n_batch_points = (n+n_batches-1)/n_batches;

    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        max_points = secp256k1_strauss_max_points(scratch);
        if (max_points == 0) {
            return 0;
        }
        n_batches = (n+max_points-1)/max_points;
        n_batch_points = (n+n_batches-1)/n_batches;
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(ctx, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}